

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.h
# Opt level: O0

void __thiscall StatisticsMgr::~StatisticsMgr(StatisticsMgr *this)

{
  StatisticsMgr *this_local;
  
  LinkList<Statistic>::~LinkList(&this->llStats);
  return;
}

Assistant:

StatisticsMgr() {}